

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_output.cpp
# Opt level: O1

void __thiscall Clasp::Cli::JsonOutput::printKeyValue(JsonOutput *this,char *k,StatisticObject *o)

{
  double dVar1;
  
  dVar1 = StatisticObject::value(o);
  printKey(this,k);
  if (NAN(dVar1)) {
    printf("%s","null");
  }
  else {
    printf("%g");
  }
  this->open_ = ",\n";
  return;
}

Assistant:

void JsonOutput::printKeyValue(const char* k, const StatisticObject& o) {
	double v = o.value();
	printKey(k);
	if (!isNan(v)) { printf("%g", v); }
	else           { printf("%s", "null"); }
	open_ = ",\n";
}